

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHMap.hpp
# Opt level: O1

int __thiscall
Lib::
DHMap<Kernel::Unit_*,_std::unique_ptr<Lib::InferenceExtra,_std::default_delete<Lib::InferenceExtra>_>,_Lib::DefaultHash,_Lib::DefaultHash2>
::remove(DHMap<Kernel::Unit_*,_std::unique_ptr<Lib::InferenceExtra,_std::default_delete<Lib::InferenceExtra>_>,_Lib::DefaultHash,_Lib::DefaultHash2>
         *this,char *__filename)

{
  Unit *pUVar1;
  InferenceExtra *pIVar2;
  Entry *pEVar3;
  Unit **in_RDX;
  
  pEVar3 = findEntry((DHMap<Kernel::Unit_*,_std::unique_ptr<Lib::InferenceExtra,_std::default_delete<Lib::InferenceExtra>_>,_Lib::DefaultHash,_Lib::DefaultHash2>
                      *)__filename,in_RDX);
  if (pEVar3 == (Entry *)0x0) {
    this->_timestamp = 0;
    this->_size = 0;
    this->_deleted = 0;
    this->_capacityIndex = 0;
    this->_capacity = 0;
    this->_nextExpansionOccupancy = 0;
  }
  else {
    *(byte *)&pEVar3->field_0 = *(byte *)&pEVar3->field_0 | 1;
    *(ulong *)(__filename + 4) =
         CONCAT44((int)((ulong)*(undefined8 *)(__filename + 4) >> 0x20) + 1,
                  (int)*(undefined8 *)(__filename + 4) + -1);
    pUVar1 = pEVar3->_key;
    pIVar2 = (pEVar3->_val)._M_t.
             super___uniq_ptr_impl<Lib::InferenceExtra,_std::default_delete<Lib::InferenceExtra>_>.
             _M_t.
             super__Tuple_impl<0UL,_Lib::InferenceExtra_*,_std::default_delete<Lib::InferenceExtra>_>
             .super__Head_base<0UL,_Lib::InferenceExtra_*,_false>._M_head_impl;
    (pEVar3->_val)._M_t.
    super___uniq_ptr_impl<Lib::InferenceExtra,_std::default_delete<Lib::InferenceExtra>_>._M_t.
    super__Tuple_impl<0UL,_Lib::InferenceExtra_*,_std::default_delete<Lib::InferenceExtra>_>.
    super__Head_base<0UL,_Lib::InferenceExtra_*,_false>._M_head_impl = (InferenceExtra *)0x0;
    *(undefined1 *)&this->_timestamp = 1;
    *(Unit **)&this->_deleted = pUVar1;
    *(InferenceExtra **)&this->_capacity = pIVar2;
  }
  return (int)this;
}

Assistant:

Option<std::pair<Key,Val>> remove(Key const& key)
  {
    Entry* e=findEntry(key);
    if(!e) {
      return {};
    }
    e->_info.deleted=1;
    _size--;
    _deleted++;
    return some(std::pair<Key,Val>(move_if_value<Key>(e->_key), move_if_value<Val>(e->_val)));
  }